

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Reader.cpp
# Opt level: O2

StepStatus __thiscall
adios2::core::engine::BP4Reader::BeginStep(BP4Reader *this,StepMode mode,float timeoutSeconds)

{
  IO *this_00;
  byte bVar1;
  int iVar2;
  StepStatus SVar3;
  size_t sVar4;
  allocator local_cc;
  allocator local_cb;
  allocator local_ca;
  allocator local_c9;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  float local_44;
  ScopedTimer __var281;
  string local_38;
  
  local_44 = timeoutSeconds;
  if ((BeginStep(adios2::StepMode,float)::__var81 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&BeginStep(adios2::StepMode,float)::__var81), iVar2 != 0)) {
    BeginStep::__var81 = (void *)ps_timer_create_("BP4Reader::BeginStep");
    __cxa_guard_release(&BeginStep(adios2::StepMode,float)::__var81);
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer(&__var281,BeginStep::__var81);
  std::__cxx11::string::string((string *)&local_c8,"Engine",&local_ca);
  std::__cxx11::string::string((string *)&local_68,"BP4Reader",&local_cb);
  std::__cxx11::string::string((string *)&local_88,"BeginStep",&local_cc);
  std::__cxx11::to_string(&local_a8,this->m_CurrentStep);
  iVar2 = helper::Comm::Rank(&(this->super_Engine).m_Comm);
  helper::Log(&local_c8,&local_68,&local_88,&local_a8,0,iVar2,5,this->m_Verbosity,INFO);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_c8);
  if (mode != Read) {
    std::__cxx11::string::string((string *)&local_c8,"Engine",&local_ca);
    std::__cxx11::string::string((string *)&local_68,"BP4Reader",&local_cb);
    std::__cxx11::string::string((string *)&local_88,"BeginStep",&local_cc);
    std::__cxx11::string::string
              ((string *)&local_a8,
               "mode is not supported yet, only Read is valid for engine BP4Reader, in call to BeginStep"
               ,&local_c9);
    helper::Throw<std::invalid_argument>(&local_c8,&local_68,&local_88,&local_a8,-1);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  if ((this->super_Engine).m_BetweenStepPairs == true) {
    std::__cxx11::string::string((string *)&local_c8,"Engine",&local_ca);
    std::__cxx11::string::string((string *)&local_68,"BP4Reader",&local_cb);
    std::__cxx11::string::string((string *)&local_88,"BeginStep",&local_cc);
    std::__cxx11::string::string
              ((string *)&local_a8,
               "BeginStep() is called a second time without an intervening EndStep()",&local_c9);
    helper::Throw<std::logic_error>(&local_c8,&local_68,&local_88,&local_a8,-1);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  if (*(long *)((this->m_BP4Deserializer)._vptr_BP4Deserializer[-4] + 0x390 +
               (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer) != 0) {
    std::__cxx11::string::string((string *)&local_c8,"Engine",&local_ca);
    std::__cxx11::string::string((string *)&local_68,"BP4Reader",&local_cb);
    std::__cxx11::string::string((string *)&local_88,"BeginStep",&local_cc);
    std::__cxx11::string::string
              ((string *)&local_a8,
               "existing variables subscribed with GetDeferred, did you forget to call PerformGets() or EndStep()?, in call to BeginStep"
               ,&local_c9);
    helper::Throw<std::invalid_argument>(&local_c8,&local_68,&local_88,&local_a8,-1);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  ((this->super_Engine).m_IO)->m_ReadStreaming = true;
  bVar1 = this->m_FirstStep;
  if ((bool)bVar1 == true) {
    if (*(long *)((this->m_BP4Deserializer)._vptr_BP4Deserializer[-4] + 0x1d0 +
                 (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer) == 0) {
LAB_004985e0:
      SVar3 = CheckForNewSteps(this,(Seconds)(double)local_44);
      if (SVar3 != OK) goto LAB_0049867e;
      bVar1 = this->m_FirstStep;
    }
  }
  else if (*(ulong *)((this->m_BP4Deserializer)._vptr_BP4Deserializer[-4] + 0x1d0 +
                     (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer) <=
           this->m_CurrentStep + 1) goto LAB_004985e0;
  (this->super_Engine).m_BetweenStepPairs = true;
  if ((bVar1 & 1) == 0) {
    sVar4 = this->m_CurrentStep + 1;
    this->m_CurrentStep = sVar4;
  }
  else {
    this->m_FirstStep = false;
    sVar4 = this->m_CurrentStep;
  }
  this_00 = (this->super_Engine).m_IO;
  this_00->m_EngineStep = sVar4;
  std::__cxx11::string::string
            ((string *)&local_38,"in call to BP4 Reader BeginStep",(allocator *)&local_c8);
  SVar3 = OK;
  IO::ResetVariablesStepSelection(this_00,false,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  IO::SetPrefixedNames((this->super_Engine).m_IO,true);
LAB_0049867e:
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var281);
  return SVar3;
}

Assistant:

StepStatus BP4Reader::BeginStep(StepMode mode, const float timeoutSeconds)
{
    PERFSTUBS_SCOPED_TIMER("BP4Reader::BeginStep");
    helper::Log("Engine", "BP4Reader", "BeginStep", std::to_string(CurrentStep()), 0, m_Comm.Rank(),
                5, m_Verbosity, helper::LogMode::INFO);

    if (mode != StepMode::Read)
    {
        helper::Throw<std::invalid_argument>("Engine", "BP4Reader", "BeginStep",
                                             "mode is not supported yet, "
                                             "only Read is valid for "
                                             "engine BP4Reader, in call to "
                                             "BeginStep");
    }

    if (m_BetweenStepPairs)
    {
        helper::Throw<std::logic_error>("Engine", "BP4Reader", "BeginStep",
                                        "BeginStep() is called a second time "
                                        "without an intervening EndStep()");
    }

    if (!m_BP4Deserializer.m_DeferredVariables.empty())
    {
        helper::Throw<std::invalid_argument>("Engine", "BP4Reader", "BeginStep",
                                             "existing variables subscribed with "
                                             "GetDeferred, did you forget to call "
                                             "PerformGets() or EndStep()?, in call to BeginStep");
    }

    // used to inquire for variables in streaming mode
    m_IO.m_ReadStreaming = true;
    StepStatus status = StepStatus::OK;

    if (m_FirstStep)
    {
        if (m_BP4Deserializer.m_MetadataSet.StepsCount == 0)
        {
            status = CheckForNewSteps(Seconds(timeoutSeconds));
        }
    }
    else
    {
        if (m_CurrentStep + 1 >= m_BP4Deserializer.m_MetadataSet.StepsCount)
        {
            status = CheckForNewSteps(Seconds(timeoutSeconds));
        }
    }

    // This should be after getting new steps

    if (status == StepStatus::OK)
    {
        m_BetweenStepPairs = true;
        if (m_FirstStep)
        {
            m_FirstStep = false;
        }
        else
        {
            ++m_CurrentStep;
        }

        m_IO.m_EngineStep = m_CurrentStep;
        m_IO.ResetVariablesStepSelection(false, "in call to BP4 Reader BeginStep");

        // caches attributes for each step
        // if a variable name is a prefix
        // e.g. var  prefix = {var/v1, var/v2, var/v3}
        m_IO.SetPrefixedNames(true);
    }

    return status;
}